

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O0

Handle remote::OpenProcess(string *name)

{
  bool bVar1;
  int iVar2;
  DIR *__dirp;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  string local_1218 [36];
  int local_11f4;
  long local_11f0;
  size_t lastSlash;
  string path;
  stringstream local_11b8 [8];
  stringstream ss;
  ostream local_11a8 [380];
  pid_t local_102c;
  char local_1028 [4];
  pid_t pid;
  char maps [4096];
  dirent *dire;
  DIR *dir;
  string *name_local;
  Handle hProcess;
  
  __dirp = opendir("/proc/");
  if (__dirp == (DIR *)0x0) {
LAB_0010ab8d:
    Handle::Handle((Handle *)((long)&name_local + 4),-1);
  }
  else {
    maps[0xff8] = '\0';
    maps[0xff9] = '\0';
    maps[0xffa] = '\0';
    maps[0xffb] = '\0';
    maps[0xffc] = '\0';
    maps[0xffd] = '\0';
    maps[0xffe] = '\0';
    maps[0xfff] = '\0';
    do {
      do {
        do {
          do {
            maps._4088_8_ = readdir(__dirp);
            if ((dirent *)maps._4088_8_ == (dirent *)0x0) {
              maps[0xff8] = '\0';
              maps[0xff9] = '\0';
              maps[0xffa] = '\0';
              maps[0xffb] = '\0';
              maps[0xffc] = '\0';
              maps[0xffd] = '\0';
              maps[0xffe] = '\0';
              maps[0xfff] = '\0';
              goto LAB_0010ab8d;
            }
          } while (((dirent *)maps._4088_8_)->d_type != '\x04');
          sVar3 = strspn(((dirent *)maps._4088_8_)->d_name,"0123456789");
          sVar4 = strlen((char *)(maps._4088_8_ + 0x13));
        } while (sVar3 != sVar4);
        strncpy(local_1028,"/proc/",0x1000);
        strncat(local_1028,(char *)(maps._4088_8_ + 0x13),0x1000);
        strncat(local_1028,"/maps",0x1000);
        iVar2 = access(local_1028,0);
      } while (iVar2 == -1);
      std::__cxx11::stringstream::stringstream(local_11b8);
      poVar5 = (ostream *)std::ostream::operator<<(local_11a8,std::dec);
      std::operator<<(poVar5,(char *)(maps._4088_8_ + 0x13));
      std::istream::operator>>((istream *)local_11b8,&local_102c);
      name_local._4_4_ = OpenProcess(local_102c);
      path.field_2._8_4_ = 0xffffffff;
      bVar1 = Handle::operator!=((Handle *)((long)&name_local + 4),
                                 (pid_t *)(path.field_2._M_local_buf + 8));
      if (bVar1) {
        Handle::GetPath_abi_cxx11_((string *)&lastSlash,(Handle *)((long)&name_local + 4));
        local_11f0 = std::__cxx11::string::find_last_of((char)&lastSlash,0x2f);
        if (local_11f0 == -1) {
          local_11f4 = 2;
        }
        else {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_1218,(ulong)&lastSlash);
          iVar2 = std::__cxx11::string::compare(local_1218);
          std::__cxx11::string::~string(local_1218);
          if (iVar2 == 0) {
            local_11f4 = 1;
          }
          else {
            local_11f4 = 0;
          }
        }
        std::__cxx11::string::~string((string *)&lastSlash);
        if (local_11f4 == 0) goto LAB_0010ab3e;
      }
      else {
LAB_0010ab3e:
        local_11f4 = 0;
      }
      std::__cxx11::stringstream::~stringstream(local_11b8);
    } while ((local_11f4 == 0) || (local_11f4 != 1));
  }
  return (Handle)name_local._4_4_;
}

Assistant:

Handle remote::OpenProcess(string name) {
    DIR* dir = opendir("/proc/");

    if(dir) {
        dirent* dire = NULL;

        while((dire = readdir(dir)) != NULL) {
            if(dire->d_type != DT_DIR)
                continue;

            // Check numeric
            if(strspn(dire->d_name, "0123456789") != strlen(dire->d_name))
                continue;

            char maps[PATH_MAX];
            strncpy(maps, "/proc/", PATH_MAX);
            strncat(maps, dire->d_name, PATH_MAX);
            strncat(maps, "/maps", PATH_MAX);

            if (access(maps, F_OK) == -1)
                continue;

            pid_t pid;

            stringstream ss;
            ss << dec << dire->d_name;
            ss >> pid;

            Handle hProcess = OpenProcess(pid);

            if(hProcess != INVALID_HANDLE_VALUE) {
                string path = hProcess.GetPath();

                size_t lastSlash = path.find_last_of('/');

                if(lastSlash == -1)
                    continue;

                if(path.substr(lastSlash, path.size()).compare(name) == 0)
                    return hProcess;
            }
        }
    }

    return INVALID_HANDLE_VALUE;
}